

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O3

CURLcode Curl_ssl_scache_create
                   (size_t max_peers,size_t max_sessions_per_peer,Curl_ssl_scache **pscache)

{
  uchar *puVar1;
  Curl_ssl_scache_peer *pCVar2;
  Curl_ssl_scache *pCVar3;
  CURLcode CVar4;
  ulong uVar5;
  long lVar6;
  
  *pscache = (Curl_ssl_scache *)0x0;
  pCVar2 = (Curl_ssl_scache_peer *)(*Curl_ccalloc)(max_peers,0xa8);
  CVar4 = CURLE_OUT_OF_MEMORY;
  if (pCVar2 != (Curl_ssl_scache_peer *)0x0) {
    pCVar3 = (Curl_ssl_scache *)(*Curl_ccalloc)(1,0x28);
    if (pCVar3 == (Curl_ssl_scache *)0x0) {
      (*Curl_cfree)(pCVar2);
    }
    else {
      pCVar3->magic = 0xe1551;
      pCVar3->default_lifetime_secs = 0x15180;
      pCVar3->peer_count = max_peers;
      pCVar3->peers = pCVar2;
      pCVar3->age = 1;
      if (max_peers != 0) {
        lVar6 = 0x90;
        uVar5 = 0;
        do {
          puVar1 = pCVar3->peers->key_salt + lVar6 + -0x50;
          *(size_t *)puVar1 = max_sessions_per_peer;
          Curl_llist_init((Curl_llist *)(puVar1 + -0x70),cf_ssl_scache_sesssion_ldestroy);
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0xa8;
        } while (uVar5 < pCVar3->peer_count);
      }
      *pscache = pCVar3;
      CVar4 = CURLE_OK;
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_ssl_scache_create(size_t max_peers,
                                size_t max_sessions_per_peer,
                                struct Curl_ssl_scache **pscache)
{
  struct Curl_ssl_scache *scache;
  struct Curl_ssl_scache_peer *peers;
  size_t i;

  *pscache = NULL;
  peers = calloc(max_peers, sizeof(*peers));
  if(!peers)
    return CURLE_OUT_OF_MEMORY;

  scache = calloc(1, sizeof(*scache));
  if(!scache) {
    free(peers);
    return CURLE_OUT_OF_MEMORY;
  }

  scache->magic = CURL_SCACHE_MAGIC;
  scache->default_lifetime_secs = (24*60*60); /* 1 day */
  scache->peer_count = max_peers;
  scache->peers = peers;
  scache->age = 1;
  for(i = 0; i < scache->peer_count; ++i) {
    scache->peers[i].max_sessions = max_sessions_per_peer;
    Curl_llist_init(&scache->peers[i].sessions,
                    cf_ssl_scache_sesssion_ldestroy);
  }

  *pscache = scache;
  return CURLE_OK;
}